

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<unsigned_int>(String *__return_storage_ptr__,uint *params)

{
  uint *value;
  CappedArray<char,_14UL> *params_00;
  CappedArray<char,_14UL> local_30;
  uint *local_18;
  uint *params_local;
  
  local_18 = params;
  params_local = (uint *)__return_storage_ptr__;
  value = fwd<unsigned_int>(params);
  toCharSequence<unsigned_int>(&local_30,value);
  _::concat<kj::CappedArray<char,14ul>>(__return_storage_ptr__,(_ *)&local_30,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}